

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xdr_inline.h
# Opt level: O2

_Bool xdr_opaque_decode(XDR *xdrs,char *cp,u_int cnt)

{
  _Bool _Var1;
  uint32_t crud;
  
  if (cnt == 0) {
    return true;
  }
  _Var1 = (*xdrs->x_ops->x_getbytes)(xdrs,cp,cnt);
  if (_Var1) {
    if ((cnt & 3) == 0) {
      return true;
    }
    _Var1 = (*xdrs->x_ops->x_getbytes)(xdrs,(char *)&crud,4 - (cnt & 3));
    if (_Var1) {
      return true;
    }
    if (((byte)__ntirpc_pkg_params.debug_flags & 1) != 0) {
      (*__ntirpc_pkg_params.warnx_)("%s:%u ERROR crud","xdr_opaque_decode",0x1c9);
    }
  }
  else if (((byte)__ntirpc_pkg_params.debug_flags & 1) != 0) {
    (*__ntirpc_pkg_params.warnx_)("%s:%u ERROR opaque","xdr_opaque_decode",0x1b9);
    return false;
  }
  return false;
}

Assistant:

static inline bool
xdr_opaque_decode(XDR *xdrs, char *cp, u_int cnt)
{
	u_int rndup;

	/*
	 * if no data we are done
	 */
	if (cnt == 0)
		return (true);

	/*
	 * XDR_INLINE is just as likely to do a function call,
	 * so don't bother with it here.
	 */
	if (!XDR_GETBYTES(xdrs, cp, cnt)) {
		__warnx(TIRPC_DEBUG_FLAG_ERROR,
			"%s:%u ERROR opaque",
			__func__, __LINE__);
		return (false);
	}

	/*
	 * round byte count to full xdr units
	 */
	rndup = cnt & (BYTES_PER_XDR_UNIT - 1);

	if (rndup > 0) {
		uint32_t crud;

		if (!XDR_GETBYTES(xdrs, (char *) &crud,
				  BYTES_PER_XDR_UNIT - rndup)) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR crud",
				__func__, __LINE__);
			return (false);
		}
	}

	return (true);
}